

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_BoyerMooreFind.h
# Opt level: O2

size_t __thiscall
axl::sl::
BoyerMooreFindBase<axl::sl::BoyerMooreDetailsBase<char,axl::sl::BoyerMooreSkipTablesBase<char>,true,256ul>>
::findImpl<axl::sl::PtrIterator<char_const,true>>
          (BoyerMooreFindBase<axl::sl::BoyerMooreDetailsBase<char,axl::sl::BoyerMooreSkipTablesBase<char>,true,256ul>>
           *this,PtrIterator<const_char,_true> *accessor,size_t i0,size_t length)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  bool bVar6;
  
  uVar2 = (*(long *)(this + 0x10) + i0) - 1;
  lVar4 = *(long *)(this + 0x10) + -1;
  do {
    if (length <= uVar2) {
      return uVar2 - lVar4;
    }
    lVar5 = lVar4;
    for (lVar3 = -uVar2; accessor->m_p[lVar3] == *(char *)(*(long *)this + lVar5); lVar3 = lVar3 + 1
        ) {
      bVar6 = lVar5 == 0;
      lVar5 = lVar5 + -1;
      if (bVar6) {
        return -lVar3;
      }
    }
    uVar1 = *(ulong *)(*(long *)(this + 0x18) +
                      ((ulong)(long)accessor->m_p[lVar3] % *(ulong *)(this + 0x28)) * 8);
    uVar2 = *(ulong *)(*(long *)(this + 0x30) + lVar5 * 8);
    if (uVar2 < uVar1) {
      uVar2 = uVar1;
    }
    uVar2 = uVar2 - lVar3;
  } while( true );
}

Assistant:

size_t
	findImpl(
		const Accessor& accessor,
		size_t i0,
		size_t length
	) const {
		size_t last = m_pattern.getCount() - 1;
		size_t i = i0 + last;
		while (i < length) {
			intptr_t j = last;
			C c;
			for (;;) {
				c = accessor[i];
				if (c != m_pattern[j])
					break;

				if (j == 0)
					return i;

				i--;
				j--;
			}

			i += m_skipTables.getSkip(c, j);
		}

		return i - last; // prospective start of match
	}